

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

int qstrnicmp(char *str1,char *str2,size_t len)

{
  int iVar1;
  int unaff_EBP;
  char cVar2;
  size_t sVar3;
  
  if (str2 == (char *)0x0 || str1 == (char *)0x0) {
    iVar1 = 1;
    if (str1 == (char *)0x0) {
      iVar1 = -(uint)(str2 != (char *)0x0);
    }
  }
  else {
    for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
      cVar2 = str1[sVar3];
      iVar1 = QtMiscUtils::caseCompareAscii(cVar2,str2[sVar3]);
      cVar2 = (cVar2 == '\0') * '\x02';
      if (iVar1 != 0) {
        cVar2 = '\x01';
        unaff_EBP = iVar1;
      }
      if (cVar2 != '\0') {
        if (cVar2 == '\x02') {
          return 0;
        }
        return unaff_EBP;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int qstrnicmp(const char *str1, const char *str2, size_t len)
{
    const uchar *s1 = reinterpret_cast<const uchar *>(str1);
    const uchar *s2 = reinterpret_cast<const uchar *>(str2);
    if (!s1 || !s2)
        return s1 ? 1 : (s2 ? -1 : 0);
    for (; len--; ++s1, ++s2) {
        const uchar c = *s1;
        if (int res = QtMiscUtils::caseCompareAscii(c, *s2))
            return res;
        if (!c)                                // strings are equal
            break;
    }
    return 0;
}